

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::maxwell_dist<double>::cdf(maxwell_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar1;
  double dVar2;
  result_type_conflict2 rVar3;
  double dVar4;
  
  rVar1 = param_type::theta(in_RDI);
  dVar2 = erf((in_XMM0_Qa * 0.7071067811865476) / rVar1);
  rVar1 = param_type::theta(in_RDI);
  rVar3 = param_type::theta(in_RDI);
  dVar4 = exp((-in_XMM0_Qa * in_XMM0_Qa) / (rVar1 * 2.0 * rVar3));
  rVar1 = param_type::theta(in_RDI);
  return dVar2 - (in_XMM0_Qa * 0.7978845608028654 * dVar4) / rVar1;
}

Assistant:

cdf(result_type x) const {
      return math::erf(x * math::constants<result_type>::one_over_sqrt_2 / P.theta()) -
             math::constants<result_type>::sqrt_2_over_pi * x *
                 math::exp(-x * x / (2 * P.theta() * P.theta())) / (P.theta());
    }